

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  undefined4 extraout_EAX;
  uint uVar7;
  ImVec2 in_RAX;
  ImDrawList *this;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  int layer;
  ImGuiOldColumns *columns;
  char *pcVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  if (window != (ImGuiWindow *)0x0) {
    bVar6 = window->WasActive;
    bVar20 = GImGui->NavWindow == window;
    pcVar9 = (char *)(ulong)bVar20;
    local_38 = in_RAX;
    if (bVar6 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar12 = " *Inactive*";
    }
    else {
      pcVar12 = "";
    }
    bVar20 = TreeNodeEx(label,(uint)bVar20,"%s \'%s\'%s",label,window->Name,pcVar12);
    if (bVar6 == false) {
      PopStyleColor(1);
    }
    bVar5 = IsItemHovered(0);
    if ((bVar5 & bVar6) == 1) {
      this = GetViewportBgFgDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      pcVar9 = (char *)&window->Pos;
      local_38.x = (window->Size).x + (window->Pos).x;
      local_38.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(this,(ImVec2 *)pcVar9,&local_38,0xff00ffff,0.0,0,1.0);
    }
    if (bVar20) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      if ((pIVar4->IO).ConfigDebugIsDebuggerPresent == true) {
        pcVar9 = "in Begin()";
        bVar6 = DebugBreakButton("**DebugBreak**","in Begin()");
        if (bVar6) {
          pIVar4->DebugBreakInWindow = window->ID;
        }
      }
      uVar8 = window->Flags;
      DebugNodeDrawList(window,(ImGuiViewportP *)pcVar9,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar9 = "Child ";
      if ((uVar8 >> 0x18 & 1) == 0) {
        pcVar9 = "";
      }
      auVar25._0_4_ = -(uint)((uVar8 & 0x10000000) == 0);
      auVar25._4_4_ = -(uint)((uVar8 & 0x8000000) == 0);
      auVar25._8_4_ = -(uint)((uVar8 & 0x4000000) == 0);
      auVar25._12_4_ = -(uint)((uVar8 & 0x2000000) == 0);
      auVar24._0_4_ = -(uint)((uVar8 & 0x40) == 0);
      auVar24._4_4_ = -(uint)((uVar8 & 0x10000) == 0);
      auVar24._8_4_ = -(uint)((uVar8 & 0x200) == 0);
      auVar24._12_4_ = -(uint)((uVar8 & 0x100) == 0);
      auVar25 = packssdw(auVar24,auVar25);
      auVar25 = packsswb(auVar25,auVar25);
      pcVar12 = "Tooltip ";
      if ((auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar12 = "";
      }
      pcVar10 = "Popup ";
      if ((auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar10 = "";
      }
      pcVar13 = "Modal ";
      if ((auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "";
      }
      pcVar14 = "ChildMenu ";
      if ((auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "";
      }
      pcVar15 = "NoSavedSettings ";
      if ((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar19 = "NoMouseInputs";
      if ((auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar19 = "";
      }
      pcVar16 = "NoNavInputs";
      if ((auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16 = "";
      }
      pcVar18 = "AlwaysAutoResize";
      if ((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar18 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar8,pcVar9,pcVar12,pcVar10,pcVar13,
                 pcVar14,pcVar15,pcVar19,pcVar16,pcVar18);
      if ((uVar8 >> 0x18 & 1) != 0) {
        uVar8 = window->ChildFlags;
        auVar22._0_4_ = -(uint)((uVar8 & 0x100) == 0);
        auVar22._4_4_ = -(uint)((uVar8 & 8) == 0);
        auVar22._8_4_ = -(uint)((uVar8 & 4) == 0);
        auVar22._12_4_ = -(uint)((uVar8 & 1) == 0);
        uVar7 = movmskps(extraout_EAX,auVar22);
        pcVar9 = "Border ";
        if ((uVar7 & 8) != 0) {
          pcVar9 = "";
        }
        pcVar12 = "ResizeX ";
        if ((uVar7 & 4) != 0) {
          pcVar12 = "";
        }
        pcVar10 = "ResizeY ";
        if ((uVar7 & 2) != 0) {
          pcVar10 = "";
        }
        pcVar13 = "NavFlattened ";
        if ((uVar7 & 1) != 0) {
          pcVar13 = "";
        }
        BulletText("ChildFlags: 0x%08X (%s%s%s%s..)",(ulong)uVar8,pcVar9,pcVar12,pcVar10,pcVar13);
      }
      pcVar9 = "X";
      if (window->ScrollbarX == false) {
        pcVar9 = "";
      }
      pcVar12 = "Y";
      if (window->ScrollbarY == false) {
        pcVar12 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,(double)(window->Scroll).y,
                 (double)(window->ScrollMax).y,pcVar9,pcVar12);
      if ((window->Active != false) || (uVar11 = 0xffffffff, window->WasActive != false)) {
        uVar11 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar11)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      lVar17 = 0x3c0;
      uVar8 = 0;
      do {
        fVar1 = *(float *)((long)window + lVar17 * 4 + -0xb38);
        fVar2 = *(float *)((long)window + lVar17 * 4 + -0xb34);
        fVar3 = *(float *)((long)window + lVar17 * 4 + -0xb2c);
        if ((fVar1 < fVar3) || (fVar2 < fVar3)) {
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar2
                     ,(double)*(float *)((long)window + lVar17 * 4 + -0xb30),(double)fVar3,
                     (ulong)uVar8,(ulong)*(uint *)((long)&window->Ctx + lVar17));
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)uVar8,
                     (ulong)*(uint *)((long)&window->Ctx + lVar17));
        }
        DebugLocateItemOnHover(*(ImGuiID *)((long)&window->Ctx + lVar17));
        lVar17 = lVar17 + 4;
        uVar8 = uVar8 + 1;
      } while (lVar17 == 0x3c4);
      uVar11 = 0;
      do {
        fVar1 = window->NavPreferredScoringPosRel[uVar11].x;
        dVar21 = (double)fVar1;
        if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
          dVar21 = -99999.0;
        }
        fVar1 = window->NavPreferredScoringPosRel[uVar11].y;
        dVar23 = (double)fVar1;
        if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
          dVar23 = -99999.0;
        }
        BulletText("NavPreferredScoringPosRel[%d] = {%.1f,%.1f)",dVar21,dVar23,uVar11 & 0xffffffff);
        uVar11 = uVar11 + 1;
      } while (uVar11 == 1);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar9 = "NULL";
      }
      else {
        pcVar9 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar9);
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (window->ParentWindowForFocusRoute != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindowForFocusRoute,"ParentWindowForFocusRoute");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar6 = TreeNode("Columns","Columns sets (%d)");
        if (bVar6) {
          lVar17 = (long)(window->ColumnsStorage).Size;
          if (lVar17 != 0) {
            columns = (window->ColumnsStorage).Data;
            lVar17 = lVar17 * 0x88;
            do {
              DebugNodeColumns(columns);
              columns = columns + 1;
              lVar17 = lVar17 + -0x88;
            } while (lVar17 != 0);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    if (g.IO.ConfigDebugIsDebuggerPresent && DebugBreakButton("**DebugBreak**", "in Begin()"))
        g.DebugBreakInWindow = window->ID;

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    if (flags & ImGuiWindowFlags_ChildWindow)
        BulletText("ChildFlags: 0x%08X (%s%s%s%s..)", window->ChildFlags,
            (window->ChildFlags & ImGuiChildFlags_Border) ? "Border " : "",
            (window->ChildFlags & ImGuiChildFlags_ResizeX) ? "ResizeX " : "",
            (window->ChildFlags & ImGuiChildFlags_ResizeY) ? "ResizeY " : "",
            (window->ChildFlags & ImGuiChildFlags_NavFlattened) ? "NavFlattened " : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
        else
            BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        DebugLocateItemOnHover(window->NavLastIds[layer]);
    }
    const ImVec2* pr = window->NavPreferredScoringPosRel;
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
        BulletText("NavPreferredScoringPosRel[%d] = {%.1f,%.1f)", layer, (pr[layer].x == FLT_MAX ? -99999.0f : pr[layer].x), (pr[layer].y == FLT_MAX ? -99999.0f : pr[layer].y)); // Display as 99999.0f so it looks neater.
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)               { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)               { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->ParentWindowForFocusRoute != NULL)  { DebugNodeWindow(window->ParentWindowForFocusRoute, "ParentWindowForFocusRoute"); }
    if (window->DC.ChildWindows.Size > 0)           { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (ImGuiOldColumns& columns : window->ColumnsStorage)
            DebugNodeColumns(&columns);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}